

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_palette.c
# Opt level: O2

bool_t prf_color_palette_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  pool_t pool_id;
  uint16_t uVar1;
  ushort uVar2;
  uint32_t uVar3;
  uint8_t *buffer;
  uint uVar4;
  bool_t bVar5;
  uint uVar6;
  long lVar7;
  ushort *puVar8;
  uint uVar9;
  
  uVar1 = bf_get_uint16_be(bfile);
  node->opcode = uVar1;
  if (uVar1 == prf_color_palette_info.opcode) {
    uVar2 = bf_get_uint16_be(bfile);
    node->length = uVar2;
    buffer = node->data;
    if (buffer == (uint8_t *)0x0) {
      pool_id = state->model->mempool_id;
      if (pool_id == 0) {
        buffer = (uint8_t *)malloc((ulong)uVar2 - 4);
      }
      else {
        buffer = (uint8_t *)pool_malloc(pool_id,uVar2 - 4);
      }
      node->data = buffer;
      if (buffer == (uint8_t *)0x0) {
        prf_error(6,"malloc returned NULL");
        uVar6 = 4;
        goto LAB_00104d5f;
      }
      uVar2 = node->length;
    }
    if (uVar2 < 0x84) {
      uVar6 = 4;
    }
    else {
      bf_read(bfile,buffer,0x80);
      for (lVar7 = 0; uVar2 = node->length, lVar7 != 0x1000; lVar7 = lVar7 + 4) {
        if ((uint)uVar2 < (int)lVar7 + 0x88U) {
          uVar6 = (int)lVar7 + 0x84;
          goto LAB_00104df2;
        }
        uVar3 = bf_get_uint32_be(bfile);
        *(uint32_t *)(buffer + lVar7 + 0x80) = uVar3;
      }
      uVar6 = 0x1084;
LAB_00104df2:
      uVar4 = uVar6 + 4;
      if (uVar4 <= uVar2) {
        uVar6 = bf_get_uint32_be(bfile);
        *(uint *)(buffer + 0x1080) = uVar6;
        puVar8 = (ushort *)(node->data + 0x1084);
        for (uVar9 = 0; uVar9 < uVar6; uVar9 = uVar9 + 1) {
          uVar1 = bf_get_uint16_be(bfile);
          *puVar8 = uVar1;
          uVar1 = bf_get_uint16_be(bfile);
          puVar8[1] = uVar1;
          uVar1 = bf_get_uint16_be(bfile);
          puVar8[2] = uVar1;
          uVar1 = bf_get_uint16_be(bfile);
          puVar8[3] = uVar1;
          bf_read(bfile,(uint8_t *)(puVar8 + 4),*puVar8 - 8);
          uVar4 = uVar4 + *puVar8;
          puVar8 = (ushort *)((long)puVar8 + (ulong)*puVar8);
          uVar6 = *(uint *)(buffer + 0x1080);
        }
        uVar2 = node->length;
        uVar6 = uVar4;
      }
    }
    bVar5 = 1;
    uVar4 = uVar2 - uVar6;
    if (uVar4 != 0 && (int)uVar6 <= (int)(uint)uVar2) {
      bf_read(bfile,node->data + (long)(int)uVar6 + -4,uVar4);
    }
  }
  else {
    prf_error(9,"tried color palette loader for other node type");
    uVar6 = 2;
LAB_00104d5f:
    bVar5 = 0;
    bf_rewind(bfile,uVar6);
  }
  return bVar5;
}

Assistant:

static
bool_t
prf_color_palette_load_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;

    assert( node != NULL && state != NULL && bfile != NULL );

    node->opcode = bf_get_uint16_be( bfile );
    if ( node->opcode != prf_color_palette_info.opcode ) {
        prf_error( 9, "tried color palette loader for other node type" );
        bf_rewind( bfile, 2 );
        return FALSE;
    }

    node->length = bf_get_uint16_be( bfile );

    if ( node->data == NULL ) { /* not pre-allocated */
        assert( state->model != NULL );
        if ( state->model->mempool_id == 0 )
            node->data = (uint8_t *)malloc( node->length - 4 + NODE_DATA_PAD );
        else
            node->data = (uint8_t *)pool_malloc( state->model->mempool_id,
                node->length - 4 + NODE_DATA_PAD );
        if ( node->data == NULL ) {
            prf_error( 6, "malloc returned NULL" );
            bf_rewind( bfile, 4 );
            return FALSE;
        }
    }

    pos = 4;
    do {
        unsigned int i;
        uint8_t * ptr;
        node_data * data;
        data = (node_data *) node->data;
        if ( node->length < (pos + 128) ) break;
        bf_read( bfile, (uint8_t *) data->reserved1, 128 ); pos += 128;
        for ( i = 0; i < 1024 && (pos + 4) <= node->length; i++ ) {
            data->brightest_rgb[i] = bf_get_uint32_be( bfile ); pos += 4;
#if 0
	    fprintf(stderr, "palette load (%d): 0x%x\n",
		    i, data->brightest_rgb[i]);
#endif
        }

        if ( node->length < (pos + 4) ) break;
        data->num_color_names = bf_get_uint32_be( bfile ); pos += 4;
        ptr = node->data + sizeof( node_data );

        i = 0;
        while ( i < data->num_color_names ) {
            struct prf_color_name_data * cdata;
            cdata = (struct prf_color_name_data *) ptr;
            cdata->length = bf_get_uint16_be( bfile );
            cdata->reserved1 = bf_get_uint16_be( bfile );
            cdata->index = bf_get_uint16_be( bfile );
            cdata->reserved2 = bf_get_uint16_be( bfile );
            bf_read( bfile, (uint8_t *) cdata->name, cdata->length - 8 );
            pos += cdata->length;
            ptr += cdata->length;
            i++;
        }
    } while ( FALSE );

    if ( pos < node->length )
        pos += bf_read( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}